

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

PField * __thiscall PClass::AddField(PClass *this,FName *name,PType *type,DWORD flags)

{
  BYTE *pBVar1;
  TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_> *local_60;
  FName local_34;
  PField *local_30;
  PField *field;
  uint oldsize;
  DWORD flags_local;
  PType *type_local;
  FName *name_local;
  PClass *this_local;
  
  field._0_4_ = *(uint *)&(this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                          super_DObject.field_0x24;
  field._4_4_ = flags;
  _oldsize = type;
  type_local = (PType *)name;
  name_local = (FName *)this;
  FName::FName(&local_34,name);
  local_30 = PStruct::AddField(&this->super_PStruct,&local_34,_oldsize,field._4_4_);
  if (local_30 != (PField *)0x0) {
    pBVar1 = (BYTE *)M_Realloc_Dbg(this->Defaults,
                                   (ulong)*(uint *)&(this->super_PStruct).super_PNamedType.
                                                    super_PCompoundType.super_PType.super_DObject.
                                                    field_0x24,
                                   "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                                   ,0xcdd);
    this->Defaults = pBVar1;
    memset(this->Defaults + (uint)field,0,
           (ulong)(*(int *)&(this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                            super_DObject.field_0x24 - (uint)field));
    if ((this->bRuntimeClass & 1U) == 0) {
      local_60 = (TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_>
                  *)0x0;
    }
    else {
      local_60 = &this->SpecialInits;
    }
    (*(_oldsize->super_DObject)._vptr_DObject[9])
              (_oldsize,this->Defaults,(ulong)local_30->Offset,local_60);
  }
  return local_30;
}

Assistant:

PField *PClass::AddField(FName name, PType *type, DWORD flags)
{
	unsigned oldsize = Size;
	PField *field = Super::AddField(name, type, flags);
	if (field != NULL)
	{
	Defaults = (BYTE *)M_Realloc(Defaults, Size);
	memset(Defaults + oldsize, 0, Size - oldsize);
		// If this is a native class, then we must not initialize and
		// destroy any of its members. We do, however, initialize the
		// default instance since it's not a normal instance of the class.
		type->SetDefaultValue(Defaults, field->Offset,
			bRuntimeClass ? &SpecialInits : NULL);
	}
	return field;
}